

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memutil.cc
# Opt level: O0

char * absl::strings_internal::memmatch(char *phaystack,size_t haylen,char *pneedle,size_t neelen)

{
  int iVar1;
  char *__s1;
  char *hayend;
  char *match;
  size_t neelen_local;
  char *pneedle_local;
  size_t haylen_local;
  char *phaystack_local;
  
  phaystack_local = phaystack;
  if (neelen != 0) {
    if (haylen < neelen) {
      phaystack_local = (char *)0x0;
    }
    else {
      haylen_local = (size_t)phaystack;
      while (__s1 = (char *)memchr((void *)haylen_local,(int)*pneedle,
                                   (size_t)(phaystack + (((haylen - neelen) + 1) - haylen_local))),
            __s1 != (char *)0x0) {
        iVar1 = memcmp(__s1,pneedle,neelen);
        if (iVar1 == 0) {
          return __s1;
        }
        haylen_local = (size_t)(__s1 + 1);
      }
      phaystack_local = (char *)0x0;
    }
  }
  return phaystack_local;
}

Assistant:

const char* memmatch(const char* phaystack, size_t haylen, const char* pneedle,
                     size_t neelen) {
  if (0 == neelen) {
    return phaystack;  // even if haylen is 0
  }
  if (haylen < neelen) return nullptr;

  const char* match;
  const char* hayend = phaystack + haylen - neelen + 1;
  // A static cast is used here to work around the fact that memchr returns
  // a void* on Posix-compliant systems and const void* on Windows.
  while ((match = static_cast<const char*>(
              memchr(phaystack, pneedle[0], hayend - phaystack)))) {
    if (memcmp(match, pneedle, neelen) == 0)
      return match;
    else
      phaystack = match + 1;
  }
  return nullptr;
}